

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall kratos::GeneratorPortVisitor::visit(GeneratorPortVisitor *this,Generator *generator)

{
  int iVar1;
  undefined4 extraout_var;
  _Base_ptr p_Var2;
  long *plVar3;
  undefined1 local_40 [8];
  shared_ptr<kratos::Port> port;
  
  iVar1 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    for (p_Var2 = (generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(generator->ports_)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      Generator::get_port((Generator *)local_40,(string *)generator);
      process_port(generator,(Port *)local_40,(string *)(p_Var2 + 1));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
    }
    for (p_Var2 = (generator->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(generator->interfaces_)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      plVar3 = (long *)(*(long *)(p_Var2 + 2) + 0x58);
      while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
        process_port(generator,(Port *)plVar3[5],(string *)(plVar3 + 1));
      }
    }
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (!generator->parent()) {
            // this is top level module, no need to worry about it
            return;
        }
        auto const& port_names = generator->get_port_names();

        for (auto const& port_name : port_names) {
            auto port = generator->get_port(port_name);
            process_port(generator, port.get(), port_name);
        }
        // for internal interface ports
        const auto& interfaces = generator->interfaces();
        for (auto const& iter : interfaces) {
            auto const& interface = iter.second;
            auto const& ports = interface->ports();
            for (auto const& [port_name, port] : ports) {
                process_port(generator, port, port_name);
            }
        }
    }